

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

void Au_ManAddNtk(Au_Man_t *pMan,Au_Ntk_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void **ppvVar4;
  
  iVar3 = Au_ManFindNtk(pMan,p->pName);
  if (iVar3 != -1) {
    __assert_fail("Au_ManFindNtk(pMan, Au_NtkName(p)) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                  ,0x174,"void Au_ManAddNtk(Au_Man_t *, Au_Ntk_t *)");
  }
  p->pMan = pMan;
  pMan->nRefs = pMan->nRefs + 1;
  uVar1 = (pMan->vNtks).nSize;
  p->Id = uVar1;
  uVar2 = (pMan->vNtks).nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      ppvVar4 = (pMan->vNtks).pArray;
      if (ppvVar4 == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(ppvVar4,0x80);
      }
      (pMan->vNtks).pArray = ppvVar4;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar2 * 2;
      if (iVar3 <= (int)uVar2) goto LAB_00860404;
      ppvVar4 = (pMan->vNtks).pArray;
      if (ppvVar4 == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(ppvVar4,(ulong)uVar2 << 4);
      }
      (pMan->vNtks).pArray = ppvVar4;
    }
    (pMan->vNtks).nCap = iVar3;
  }
LAB_00860404:
  iVar3 = (pMan->vNtks).nSize;
  (pMan->vNtks).nSize = iVar3 + 1;
  (pMan->vNtks).pArray[iVar3] = p;
  return;
}

Assistant:

void Au_ManAddNtk( Au_Man_t * pMan, Au_Ntk_t * p )
{
    assert( Au_ManFindNtk(pMan, Au_NtkName(p)) == -1 );
    p->pMan = pMan; pMan->nRefs++;
    p->Id = Vec_PtrSize( &pMan->vNtks );
    Vec_PtrPush( &pMan->vNtks, p );
}